

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

void ts_lexer_goto(Lexer *self,Length position)

{
  uint uVar1;
  TSRange *pTVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint32_t uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  uint uVar12;
  
  uVar7 = position.extent.column;
  uVar9 = position._0_8_;
  uVar5 = uVar9 >> 0x20;
  uVar6 = self->included_range_count;
  if (uVar6 == 0) {
    bVar11 = false;
  }
  else {
    bVar11 = false;
    sVar8 = 0;
    uVar10 = 1;
    uVar12 = position.bytes;
    do {
      uVar1 = self->included_ranges[sVar8].end_byte;
      uVar4 = uVar12;
      if (uVar12 < uVar1) {
        pTVar2 = self->included_ranges + sVar8;
        if (uVar12 < pTVar2->start_byte) {
          uVar5 = (ulong)(pTVar2->start_point).row;
          uVar7 = (pTVar2->start_point).column;
          uVar4 = pTVar2->start_byte;
        }
        self->current_included_range_index = sVar8;
        bVar11 = true;
      }
      uVar9 = (ulong)uVar4;
    } while ((uVar1 <= uVar12) &&
            (bVar3 = uVar10 < uVar6, sVar8 = uVar10, uVar10 = (ulong)((int)uVar10 + 1),
            uVar12 = uVar4, bVar3));
  }
  if (!bVar11) {
    pTVar2 = self->included_ranges;
    uVar12 = pTVar2[uVar6 - 1].end_byte;
    uVar9 = (ulong)uVar12;
    uVar5 = (ulong)pTVar2[uVar6 - 1].end_point.row;
    uVar7 = pTVar2[uVar6 - 1].end_point.column;
    self->chunk = "";
    self->chunk_start = uVar12;
    self->chunk_size = 2;
  }
  uVar6 = uVar9 & 0xffffffff | uVar5 << 0x20;
  (self->token_start_position).bytes = (int)uVar6;
  (self->token_start_position).extent.row = (int)(uVar6 >> 0x20);
  (self->token_start_position).extent.column = uVar7;
  (self->token_end_position).bytes = 0;
  (self->token_end_position).extent.row = 0;
  (self->token_end_position).extent.column = 1;
  (self->current_position).bytes = (int)uVar6;
  (self->current_position).extent.row = (int)(uVar6 >> 0x20);
  (self->current_position).extent.column = uVar7;
  if ((self->chunk != (char *)0x0) &&
     (((uint)uVar9 < self->chunk_start || (self->chunk_start + self->chunk_size <= (uint)uVar9)))) {
    self->chunk = (char *)0x0;
    self->chunk_start = 0;
    self->chunk_size = 0;
  }
  self->lookahead_size = 0;
  (self->data).lookahead = 0;
  return;
}

Assistant:

static void ts_lexer_goto(Lexer *self, Length position) {
  bool found_included_range = false;
  for (unsigned i = 0; i < self->included_range_count; i++) {
    TSRange *included_range = &self->included_ranges[i];
    if (included_range->end_byte > position.bytes) {
      if (included_range->start_byte > position.bytes) {
        position = (Length) {
          .bytes = included_range->start_byte,
          .extent = included_range->start_point,
        };
      }

      self->current_included_range_index = i;
      found_included_range = true;
      break;
    }
  }

  if (!found_included_range) {
    TSRange *last_included_range = &self->included_ranges[self->included_range_count - 1];
    position = (Length) {
      .bytes = last_included_range->end_byte,
      .extent = last_included_range->end_point,
    };
    self->chunk = empty_chunk;
    self->chunk_start = position.bytes;
    self->chunk_size = 2;
  }

  self->token_start_position = position;
  self->token_end_position = LENGTH_UNDEFINED;
  self->current_position = position;

  if (self->chunk && (position.bytes < self->chunk_start ||
                      position.bytes >= self->chunk_start + self->chunk_size)) {
    self->chunk = 0;
    self->chunk_start = 0;
    self->chunk_size = 0;
  }

  self->lookahead_size = 0;
  self->data.lookahead = 0;
}